

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O0

FSerializer * Serialize<FSwitchDef>(FSerializer *arc,char *key,FSwitchDef **Switch,FSwitchDef **def)

{
  bool bVar1;
  FSwitchDef *pFVar2;
  FTextureID local_2c;
  FSwitchDef **ppFStack_28;
  FTextureID tex;
  FSwitchDef **def_local;
  FSwitchDef **Switch_local;
  char *key_local;
  FSerializer *arc_local;
  
  ppFStack_28 = def;
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    Serialize(arc,key,&(*Switch)->PreTexture,(FTextureID *)0x0);
  }
  else {
    FTextureID::FTextureID(&local_2c);
    FTextureID::SetInvalid(&local_2c);
    Serialize(arc,key,&local_2c,(FTextureID *)0x0);
    pFVar2 = FTextureManager::FindSwitch(&TexMan,local_2c);
    *Switch = pFVar2;
  }
  return arc;
}

Assistant:

FSerializer &Serialize (FSerializer &arc, const char *key, FSwitchDef* &Switch, FSwitchDef **def)
{
	if (arc.isWriting())
	{
		Serialize(arc, key, Switch->PreTexture, nullptr);
	}
	else
	{
		FTextureID tex;
		tex.SetInvalid();
		Serialize(arc, key, tex, nullptr);
		Switch = TexMan.FindSwitch(tex);
	}
	return arc;
}